

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O0

LY_ERR lyb_create_term(lyd_lyb_ctx *lybctx,lysc_node *snode,lyd_node **node)

{
  size_t sStack_40;
  LY_ERR ret__;
  uint64_t term_value_len;
  uint8_t *term_value;
  ly_bool dynamic;
  lyd_node **pplStack_28;
  LY_ERR ret;
  lyd_node **node_local;
  lysc_node *snode_local;
  lyd_lyb_ctx *lybctx_local;
  
  pplStack_28 = node;
  node_local = (lyd_node **)snode;
  snode_local = (lysc_node *)lybctx;
  term_value._4_4_ =
       lyb_read_term_value((lysc_node_leaf *)snode,(uint8_t **)&term_value_len,
                           &stack0xffffffffffffffc0,lybctx->lybctx);
  lybctx_local._4_4_ = term_value._4_4_;
  if (term_value._4_4_ == LY_SUCCESS) {
    term_value._3_1_ = '\x01';
    term_value._4_4_ =
         lyd_parser_create_term
                   ((lyd_ctx *)snode_local,(lysc_node *)node_local,(void *)term_value_len,sStack_40,
                    (ly_bool *)((long)&term_value + 3),LY_VALUE_LYB,(void *)0x0,0x3f3,pplStack_28);
    if (term_value._3_1_ != '\0') {
      free((void *)term_value_len);
    }
    if (term_value._4_4_ != LY_SUCCESS) {
      lyd_free_tree(*pplStack_28);
      *pplStack_28 = (lyd_node *)0x0;
    }
    lybctx_local._4_4_ = term_value._4_4_;
  }
  return lybctx_local._4_4_;
}

Assistant:

static LY_ERR
lyb_create_term(struct lyd_lyb_ctx *lybctx, const struct lysc_node *snode, struct lyd_node **node)
{
    LY_ERR ret;
    ly_bool dynamic;
    uint8_t *term_value;
    uint64_t term_value_len;

    ret = lyb_read_term_value((struct lysc_node_leaf *)snode, &term_value, &term_value_len, lybctx->lybctx);
    LY_CHECK_RET(ret);

    dynamic = 1;
    /* create node */
    ret = lyd_parser_create_term((struct lyd_ctx *)lybctx, snode,
            term_value, term_value_len, &dynamic, LY_VALUE_LYB,
            NULL, LYD_HINT_DATA, node);
    if (dynamic) {
        free(term_value);
    }
    if (ret) {
        lyd_free_tree(*node);
        *node = NULL;
    }

    return ret;
}